

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WeightParams * __thiscall
CoreML::Specification::BatchnormLayerParams::_internal_mutable_beta(BatchnormLayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  Arena *arena;
  
  if (this->beta_ != (WeightParams *)0x0) {
    return this->beta_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>(arena);
  this->beta_ = pWVar2;
  return pWVar2;
}

Assistant:

inline ::CoreML::Specification::WeightParams* BatchnormLayerParams::_internal_mutable_beta() {
  
  if (beta_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    beta_ = p;
  }
  return beta_;
}